

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O0

exception_type_t parse_exception_type(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    value_local._4_4_ = ET_ADDED;
  }
  else {
    iVar1 = strcmp(value,"2");
    if (iVar1 == 0) {
      value_local._4_4_ = ET_REMOVED;
    }
    else {
      value_local._4_4_ = ET_NOT_SET;
    }
  }
  return value_local._4_4_;
}

Assistant:

exception_type_t parse_exception_type(const char *value) {
    if (strcmp(value, "1") == 0)
        return ET_ADDED;
    else if (strcmp(value, "2") == 0)
        return ET_REMOVED;
    else
        return ET_NOT_SET;
}